

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

void node_accept_pattern(ACT_NODE_t *nod,AC_PATTERN_t *new_patt,int copy)

{
  size_t sVar1;
  mpool *pool;
  AC_ALPHABET_t *pAVar2;
  ac_pattid_type aVar3;
  undefined4 uVar4;
  AC_PATTERN_t *pAVar5;
  AC_ALPHABET_t *pAVar6;
  anon_union_8_2_1f4d99a2_for_u aVar7;
  size_t sVar8;
  AC_TEXT_t *new_txt;
  size_t sVar9;
  size_t sVar10;
  
  sVar8 = nod->matched_size;
  if (sVar8 == 0) {
    if (nod->matched_capacity != 0) goto LAB_00109052;
    nod->matched_capacity = 1;
    pAVar5 = (AC_PATTERN_t *)malloc(0x30);
    sVar8 = 0;
  }
  else {
    sVar1 = (new_patt->ptext).length;
    sVar9 = 0;
    do {
      if (nod->matched[sVar9].ptext.length == sVar1) {
        if (sVar1 == 0) {
          sVar10 = 0;
        }
        else {
          sVar10 = 0;
          while (nod->matched[sVar9].ptext.astring[sVar10] == (new_patt->ptext).astring[sVar10]) {
            sVar10 = sVar10 + 1;
            if (sVar1 == sVar10) {
              return;
            }
          }
        }
        if (sVar10 == sVar1) {
          return;
        }
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 != sVar8);
    if (sVar8 != nod->matched_capacity) {
LAB_00109052:
      pAVar5 = nod->matched;
      goto LAB_00109056;
    }
    nod->matched_capacity = sVar8 + 2;
    pAVar5 = (AC_PATTERN_t *)realloc(nod->matched,(sVar8 + 2) * 0x30);
    sVar8 = nod->matched_size;
  }
  nod->matched = pAVar5;
LAB_00109056:
  nod->matched_size = sVar8 + 1;
  pAVar5 = pAVar5 + sVar8;
  if (copy == 0) {
    pAVar6 = (new_patt->ptext).astring;
    sVar8 = (new_patt->ptext).length;
    pAVar2 = (new_patt->rtext).astring;
    sVar1 = (new_patt->rtext).length;
    aVar3 = (new_patt->id).type;
    uVar4 = *(undefined4 *)&(new_patt->id).field_0xc;
    (pAVar5->id).u = (new_patt->id).u;
    (pAVar5->id).type = aVar3;
    *(undefined4 *)&(pAVar5->id).field_0xc = uVar4;
    (pAVar5->rtext).astring = pAVar2;
    (pAVar5->rtext).length = sVar1;
    (pAVar5->ptext).astring = pAVar6;
    (pAVar5->ptext).length = sVar8;
  }
  else {
    pool = nod->trie->mp;
    pAVar6 = (AC_ALPHABET_t *)mpool_strndup(pool,(new_patt->ptext).astring,(new_patt->ptext).length)
    ;
    (pAVar5->ptext).astring = pAVar6;
    (pAVar5->ptext).length = (new_patt->ptext).length;
    pAVar6 = (AC_ALPHABET_t *)mpool_strndup(pool,(new_patt->rtext).astring,(new_patt->rtext).length)
    ;
    (pAVar5->rtext).astring = pAVar6;
    (pAVar5->rtext).length = (new_patt->rtext).length;
    if ((new_patt->id).type == AC_PATTID_TYPE_STRING) {
      aVar7.stringy = (char *)mpool_strdup(pool,(new_patt->id).u.stringy);
    }
    else {
      aVar7 = (new_patt->id).u;
    }
    (pAVar5->id).u.stringy = (char *)aVar7;
    (pAVar5->id).type = (new_patt->id).type;
  }
  return;
}

Assistant:

void node_accept_pattern (ACT_NODE_t *nod, AC_PATTERN_t *new_patt, int copy)
{
    AC_PATTERN_t *patt;
    
    /* Check if the new pattern already exists in the node list */
    if (node_has_pattern(nod, new_patt))
        return;
    
    /* Manage memory */
    if (nod->matched_size == nod->matched_capacity)
        node_grow_matched_vector (nod);
    
    patt = &nod->matched[nod->matched_size++];
    
    if (copy)
    {
        /* Deep copy */
        node_copy_pattern (nod, patt, new_patt);
    }
    else
    {
        /* Shallow copy */
        *patt = *new_patt;
    }
}